

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

char * QLatin1::convertFromUnicode(char *out,QStringView in,State *state)

{
  bool bVar1;
  uchar uVar2;
  uchar uVar3;
  qsizetype qVar4;
  long in_RCX;
  uchar *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype invalid;
  char replacement;
  undefined4 in_stack_ffffffffffffff88;
  Flag in_stack_ffffffffffffff8c;
  QFlags<QStringConverterBase::Flag> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  QChar in_stack_ffffffffffffff9c;
  QChar in_stack_ffffffffffffff9e;
  bool local_51;
  long local_50;
  long local_48;
  long local_38;
  uchar *local_30;
  QChar local_26;
  QChar local_24;
  char16_t local_22;
  QFlagsStorageHelper<QStringConverterBase::Flag,_4> local_20;
  QFlagsStorageHelper<QStringConverterBase::Flag,_4> local_1c;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c.super_QFlagsStorage<QStringConverterBase::Flag>.i =
       (QFlagsStorage<QStringConverterBase::Flag>)
       QFlags<QStringConverterBase::Flag>::operator&
                 (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
  local_38 = in_RCX;
  if (bVar1) {
    local_38 = 0;
  }
  local_51 = false;
  if (local_38 != 0) {
    local_20.super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorage<QStringConverterBase::Flag>)
         QFlags<QStringConverterBase::Flag>::operator&
                   (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_51 = ::QFlags::operator_cast_to_bool((QFlags *)&local_20);
  }
  uVar2 = '?';
  if (local_51 != false) {
    uVar2 = '\0';
  }
  local_48 = 0;
  local_30 = in_RDI;
  for (local_50 = 0; qVar4 = QStringView::size(&local_18), local_50 < qVar4; local_50 = local_50 + 1
      ) {
    in_stack_ffffffffffffff9e =
         QStringView::operator[]
                   ((QStringView *)
                    CONCAT26(in_stack_ffffffffffffff9e.ucs,
                             CONCAT24(in_stack_ffffffffffffff9c.ucs,in_stack_ffffffffffffff98)),
                    (qsizetype)in_stack_ffffffffffffff90);
    local_22 = in_stack_ffffffffffffff9e.ucs;
    QChar::QChar<int,_true>(&local_24,0xff);
    bVar1 = operator>((QChar *)in_stack_ffffffffffffff90,
                      (QChar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar1) {
      *local_30 = uVar2;
      local_48 = local_48 + 1;
    }
    else {
      in_stack_ffffffffffffff9c =
           QStringView::operator[]
                     ((QStringView *)
                      CONCAT26(in_stack_ffffffffffffff9e.ucs,
                               CONCAT24(in_stack_ffffffffffffff9c.ucs,in_stack_ffffffffffffff98)),
                      (qsizetype)in_stack_ffffffffffffff90);
      local_26 = in_stack_ffffffffffffff9c;
      uVar3 = QChar::cell(&local_26);
      *local_30 = uVar3;
    }
    local_30 = local_30 + 1;
  }
  if (local_38 != 0) {
    *(long *)(local_38 + 0x10) = local_48 + *(long *)(local_38 + 0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (char *)local_30;
}

Assistant:

char *QLatin1::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state) noexcept
{
    Q_ASSERT(state);
    if (state->flags & QStringConverter::Flag::Stateless) // temporary
        state = nullptr;

    const char replacement = (state && state->flags & QStringConverter::Flag::ConvertInvalidToNull) ? 0 : '?';
    qsizetype invalid = 0;
    for (qsizetype i = 0; i < in.size(); ++i) {
        if (in[i] > QChar(0xff)) {
            *out = replacement;
            ++invalid;
        } else {
            *out = (char)in[i].cell();
        }
        ++out;
    }
    if (state)
        state->invalidChars += invalid;
    return out;
}